

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O3

void __thiscall UCAFL::_uc_setup(UCAFL *this)

{
  uint uVar1;
  int iVar2;
  double __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x_00;
  
  uVar1 = uc_version(0,0);
  if (uVar1 < 0x2000100) {
    log(__x);
  }
  else {
    iVar2 = uc_hook_add(this->uc_,&this->h1_,8,_uc_hook_block,this,1,0);
    __x_00 = extraout_XMM0_Qa;
    if (((iVar2 == 0) &&
        (iVar2 = uc_hook_add(this->uc_,&this->h2_,0x8000,_uc_hook_new_tb,this,1,0),
        __x_00 = extraout_XMM0_Qa_00, iVar2 == 0)) &&
       (((this->has_cmpcov_ == false && (this->has_cmplog_ != true)) ||
        ((iVar2 = uc_hook_add(this->uc_,&this->h3_,0x10000,_uc_hook_sub,this,1,0,0,2),
         __x_00 = extraout_XMM0_Qa_01, iVar2 == 0 &&
         (iVar2 = uc_hook_add(this->uc_,&this->h4_,0x10000,_uc_hook_sub_cmp,this,1,0,0,1),
         __x_00 = extraout_XMM0_Qa_02, iVar2 == 0)))))) {
      return;
    }
    log(__x_00);
  }
  exit(1);
}

Assistant:

void _uc_setup() {
        uc_err err;
        uint32_t ver;

        ver = uc_version(NULL, NULL);

        // We need at least Unicorn 2.0.0rc5
        if (ver < MIN_UC_VERSION) {
            ERR("You Unicorn Version 0x%" PRIx32 " is not supported!\n", ver);
            exit(1);
        }

        // For coverage.
        err = uc_hook_add(this->uc_, &this->h1_, UC_HOOK_BLOCK,
                          (void*)_uc_hook_block, (void*)this, 1, 0);
        if (err) {
            ERR("Failed to setup block hook.\n");
            exit(1);
        }

        // For TB caching.
        err = uc_hook_add(this->uc_, &this->h2_, UC_HOOK_EDGE_GENERATED,
                          (void*)_uc_hook_new_tb, (void*)this, 1, 0);
        if (err) {
            ERR("Failed to setup new edge hook.\n");
            exit(1);
        }

        // If we should use Laf-Intel or Red-Queen do add CMP hooks
        if (this->has_cmpcov_ || this->has_cmplog_) {

            // These two hooks may not be supported by the arch.
            err = uc_hook_add(this->uc_, &this->h3_, UC_HOOK_TCG_OPCODE,
                            (void*)_uc_hook_sub, (void*)this, 1, 0, UC_TCG_OP_SUB,
                            UC_TCG_OP_FLAG_DIRECT);

            if (err) {
                ERR("Failed to setup UC_TCG_OP_SUB direct hook.\n");
                exit(1);
            }

            err = uc_hook_add(this->uc_, &this->h4_, UC_HOOK_TCG_OPCODE,
                            (void*)_uc_hook_sub_cmp, (void*)this, 1, 0,
                            UC_TCG_OP_SUB, UC_TCG_OP_FLAG_CMP);

            if (err) {
                ERR("Failed to setup UC_TCG_OP_SUB cmp hook.\n");
                exit(1);
            }
        }
    }